

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTContext.cpp
# Opt level: O1

Symbol * __thiscall slang::ast::ASTContext::tryFillAssertionDetails(ASTContext *this)

{
  CheckerInstanceBodySymbol *body;
  Symbol *pSVar1;
  
  if (this->assertionInstance == (AssertionInstanceDetails *)0x0) {
    for (pSVar1 = ((this->scope).ptr)->thisSym; pSVar1->kind != InstanceBody;
        pSVar1 = pSVar1->parentScope->thisSym) {
      if (pSVar1->kind == CheckerInstanceBody) {
        this->assertionInstance = (AssertionInstanceDetails *)pSVar1[2].name._M_len;
        return pSVar1;
      }
      if (pSVar1->parentScope == (Scope *)0x0) goto LAB_0026b907;
    }
  }
  else {
LAB_0026b907:
    pSVar1 = (Symbol *)0x0;
  }
  return pSVar1;
}

Assistant:

const Symbol* ASTContext::tryFillAssertionDetails() {
    if (assertionInstance)
        return nullptr;

    auto parentSym = &scope->asSymbol();
    while (true) {
        if (parentSym->kind == SymbolKind::InstanceBody)
            return parentSym;

        if (parentSym->kind == SymbolKind::CheckerInstanceBody) {
            auto& body = parentSym->as<CheckerInstanceBodySymbol>();
            assertionInstance = &body.assertionDetails;
            return parentSym;
        }

        auto nextScope = parentSym->getParentScope();
        if (!nextScope)
            break;

        parentSym = &nextScope->asSymbol();
    }

    return nullptr;
}